

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O0

double __thiscall Quat4f::log(Quat4f *this,double __x)

{
  undefined1 auVar1 [16];
  float *in_RSI;
  float fVar2;
  double dVar3;
  double dVar4;
  float coeff;
  float len;
  
  auVar1 = vfmadd213ss_fma(ZEXT416((uint)in_RSI[1]),ZEXT416((uint)in_RSI[1]),
                           ZEXT416((uint)(in_RSI[2] * in_RSI[2])));
  auVar1 = vfmadd213ss_fma(ZEXT416((uint)in_RSI[3]),ZEXT416((uint)in_RSI[3]),auVar1);
  dVar3 = sqrt((double)auVar1._0_4_);
  if (1e-06 <= (float)dVar3) {
    dVar4 = acos((double)*in_RSI);
    fVar2 = (float)(dVar4 / (double)(float)dVar3);
    dVar3 = 0.0;
    Quat4f(this,0.0,in_RSI[1] * fVar2,in_RSI[2] * fVar2,in_RSI[3] * fVar2);
  }
  else {
    dVar3 = 0.0;
    Quat4f(this,0.0,in_RSI[1],in_RSI[2],in_RSI[3]);
  }
  return dVar3;
}

Assistant:

Quat4f Quat4f::log() const
{
	float len =
		sqrt
		(
			m_elements[ 1 ] * m_elements[ 1 ] +
			m_elements[ 2 ] * m_elements[ 2 ] +
			m_elements[ 3 ] * m_elements[ 3 ]
		);

	if( len < 1e-6 )
	{
		return Quat4f( 0, m_elements[ 1 ], m_elements[ 2 ], m_elements[ 3 ] );
	}
	else
	{
		float coeff = acos( m_elements[ 0 ] ) / len;
		return Quat4f( 0, m_elements[ 1 ] * coeff, m_elements[ 2 ] * coeff, m_elements[ 3 ] * coeff );
	}
}